

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b7e868::HandleExportMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  PolicyStatus PVar4;
  const_reference pvVar5;
  reference args_00;
  ulong uVar6;
  long lVar7;
  cmGlobalGenerator *pcVar8;
  cmExportSetMap *this;
  cmExportSet *this_00;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_01;
  pointer pcVar9;
  string *__args_2;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  static_string_view sVar10;
  bool local_869;
  bool local_829;
  undefined1 local_7a0 [23];
  undefined1 local_789;
  undefined1 local_788 [16];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_778;
  bool local_76c [4];
  undefined1 local_768 [4];
  MessageLevel message;
  cmAlphaNum local_738;
  string local_708;
  bool local_6e1;
  cmTarget *pcStack_6e0;
  bool newCMP0022Behavior;
  cmTarget *tgt;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range2;
  cmExportSet *exportSet;
  cmAlphaNum local_680;
  string local_650;
  cmAlphaNum local_630;
  cmAlphaNum local_600;
  string local_5d0;
  cmAlphaNum local_5b0;
  cmAlphaNum local_580;
  string local_550;
  byte local_529;
  string local_528;
  cmAlphaNum local_508;
  cmAlphaNum local_4d8;
  string local_4a8;
  undefined1 local_488 [8];
  string fname;
  cmAlphaNum local_438;
  string local_408;
  undefined4 local_3e4;
  cmAlphaNum local_3e0;
  cmAlphaNum local_3b0;
  string local_380;
  ParseResult local_360;
  undefined1 local_330 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  bool supportCxx20FileSetTypes;
  undefined1 local_2c0 [8];
  string cxx_modules_directory;
  string filename;
  undefined1 local_278 [7];
  bool exportOld;
  string name_space;
  string exp;
  string local_228;
  undefined1 local_208 [8];
  cmInstallCommandArguments ica;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)((long)&ica.DefaultComponentName.field_2 + 8),status);
  std::__cxx11::string::string((string *)&local_228,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)(name_space.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_278);
  filename.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)(cxx_modules_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_2c0);
  sVar10 = ::cm::operator____s("EXPORT",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&name_space.field_2 + 8));
  sVar10 = ::cm::operator____s("NAMESPACE",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  sVar10 = ::cm::operator____s("EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
  cmArgumentParser<void>::Bind<bool>
            ((cmArgumentParser<void> *)local_208,sVar10,
             (bool *)(filename.field_2._M_local_buf + 0xf));
  sVar10 = ::cm::operator____s("FILE",4);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&cxx_modules_directory.field_2 + 8));
  bVar2 = cmExperimental::HasSupportEnabled((cmMakefile *)helper.Status,CxxModuleCMakeApi);
  if (bVar2) {
    sVar10 = ::cm::operator____s("CXX_MODULES_DIRECTORY",0x15);
    unknownArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar10.super_string_view._M_len;
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              ((cmArgumentParser<void> *)local_208,sVar10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_330);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_360,(cmArgumentParser<void> *)local_208,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_330,0);
  ArgumentParser::ParseResult::~ParseResult(&local_360);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_330);
  uVar1 = helper.DefaultComponentName.field_2._8_8_;
  if (!bVar2) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_3b0,pvVar5);
    cmAlphaNum::cmAlphaNum(&local_3e0," given unknown argument \"");
    args_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_330,0);
    cmStrCat<std::__cxx11::string,char[3]>
              (&local_380,&local_3b0,&local_3e0,args_00,(char (*) [3])0xd299d5);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    args_local._7_1_ = false;
    local_3e4 = 1;
    goto LAB_0060eeda;
  }
  bVar2 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_208);
  if (!bVar2) {
    args_local._7_1_ = false;
    local_3e4 = 1;
    goto LAB_0060eeda;
  }
  cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_208);
  uVar6 = std::__cxx11::string::empty();
  uVar1 = helper.DefaultComponentName.field_2._8_8_;
  if ((uVar6 & 1) != 0) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_438,pvVar5);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fname.field_2 + 8)," given no DESTINATION!");
    cmStrCat<>(&local_408,&local_438,(cmAlphaNum *)((long)&fname.field_2 + 8));
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    args_local._7_1_ = false;
    local_3e4 = 1;
    goto LAB_0060eeda;
  }
  std::__cxx11::string::string
            ((string *)local_488,(string *)(cxx_modules_directory.field_2._M_local_buf + 8));
  lVar7 = std::__cxx11::string::find_first_of(local_488,0xd48b27);
  uVar1 = helper.DefaultComponentName.field_2._8_8_;
  if (lVar7 == -1) {
    uVar3 = std::__cxx11::string::empty();
    local_529 = 0;
    local_829 = false;
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_528,(string *)local_488);
      local_529 = 1;
      local_829 = std::operator!=(&local_528,".cmake");
    }
    if ((local_529 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_528);
    }
    uVar1 = helper.DefaultComponentName.field_2._8_8_;
    if (local_829 == false) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_600,(string *)((long)&name_space.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_630,".cmake");
        cmStrCat<>(&local_5d0,&local_600,&local_630);
        std::__cxx11::string::operator=((string *)local_488,(string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        lVar7 = std::__cxx11::string::find_first_of(local_488,0xd48b27);
        uVar1 = helper.DefaultComponentName.field_2._8_8_;
        if (lVar7 != -1) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          cmAlphaNum::cmAlphaNum(&local_680,pvVar5);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&exportSet," given export name \"");
          cmStrCat<std::__cxx11::string,char[144]>
                    (&local_650,&local_680,(cmAlphaNum *)&exportSet,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name_space.field_2 + 8),
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_650);
          std::__cxx11::string::~string((string *)&local_650);
          args_local._7_1_ = false;
          goto LAB_0060eebe;
        }
      }
      pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
      this = cmGlobalGenerator::GetExportSets(pcVar8);
      this_00 = cmExportSetMap::operator[](this,(string *)((long)&name_space.field_2 + 8));
      if ((filename.field_2._M_local_buf[0xf] & 1U) != 0) {
        this_01 = cmExportSet::GetTargetExports(this_00);
        __end2 = std::
                 vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                 ::begin(this_01);
        te = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
             std::
             vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ::end(this_01);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                           *)&te), bVar2) {
          tgt = (cmTarget *)
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                ::operator*(&__end2);
          pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          pcVar9 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                             ((unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
                              tgt);
          pcStack_6e0 = cmGlobalGenerator::FindTarget(pcVar8,&pcVar9->TargetName,false);
          local_869 = false;
          if (pcStack_6e0 != (cmTarget *)0x0) {
            PVar4 = cmTarget::GetPolicyStatusCMP0022(pcStack_6e0);
            local_869 = false;
            if (PVar4 != WARN) {
              PVar4 = cmTarget::GetPolicyStatusCMP0022(pcStack_6e0);
              local_869 = PVar4 != OLD;
            }
          }
          uVar1 = helper.DefaultComponentName.field_2._8_8_;
          local_6e1 = local_869;
          if (local_869 == false) {
            cmAlphaNum::cmAlphaNum
                      (&local_738,
                       "INSTALL(EXPORT) given keyword \"EXPORT_LINK_INTERFACE_LIBRARIES\", but target \""
                      );
            pcVar9 = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::
                     operator->((unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
                                tgt);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_768,&pcVar9->TargetName);
            cmStrCat<char[43]>(&local_708,&local_738,(cmAlphaNum *)local_768,
                               (char (*) [43])"\" does not have policy CMP0022 set to NEW.");
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_708);
            std::__cxx11::string::~string((string *)&local_708);
            args_local._7_1_ = false;
            goto LAB_0060eebe;
          }
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      local_76c = (bool  [4])
                  cmInstallGenerator::SelectMessageLevel((cmMakefile *)helper.Status,false);
      local_788._0_8_ = this_00;
      __args_2 = cmInstallCommandArguments::GetDestination_abi_cxx11_
                           ((cmInstallCommandArguments *)local_208);
      __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                           ((cmInstallCommandArguments *)local_208);
      __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                           ((cmInstallCommandArguments *)local_208);
      __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                           ((cmInstallCommandArguments *)local_208);
      local_789 = (_Alloc_hider)
                  cmInstallCommandArguments::GetExcludeFromAll
                            ((cmInstallCommandArguments *)local_208);
      local_7a0[0x16] = 0;
      cmMakefile::GetBacktrace((cmMakefile *)local_7a0);
      std::
      make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,bool&,bool,cmListFileBacktrace>
                ((cmExportSet **)(local_788 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788,
                 __args_2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__args_3,__args_4,(MessageLevel *)__args_5,local_76c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_789,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 (bool *)local_2c0,(bool *)(filename.field_2._M_local_buf + 0xf),
                 (cmListFileBacktrace *)(local_7a0 + 0x16));
      std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
      unique_ptr<cmInstallExportGenerator,std::default_delete<cmInstallExportGenerator>,void>
                ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                 &local_778,
                 (unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>
                  *)(local_788 + 8));
      cmMakefile::AddInstallGenerator((cmMakefile *)helper.Status,&local_778);
      std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
                (&local_778);
      std::unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>::
      ~unique_ptr((unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>
                   *)(local_788 + 8));
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_7a0);
      args_local._7_1_ = true;
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      cmAlphaNum::cmAlphaNum(&local_580,pvVar5);
      cmAlphaNum::cmAlphaNum(&local_5b0," given invalid export file name \"");
      cmStrCat<std::__cxx11::string,char[62]>
                (&local_550,&local_580,&local_5b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 (char (*) [62])"\".  The FILE argument must specify a name ending in \".cmake\".");
      cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      args_local._7_1_ = false;
    }
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_4d8,pvVar5);
    cmAlphaNum::cmAlphaNum(&local_508," given invalid export file name \"");
    cmStrCat<std::__cxx11::string,char[93]>
              (&local_4a8,&local_4d8,&local_508,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
               (char (*) [93])
               "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
              );
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    args_local._7_1_ = false;
  }
LAB_0060eebe:
  local_3e4 = 1;
  std::__cxx11::string::~string((string *)local_488);
LAB_0060eeda:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_330);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)(cxx_modules_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(name_space.field_2._M_local_buf + 8));
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_208);
  Helper::~Helper((Helper *)((long)&ica.DefaultComponentName.field_2 + 8));
  return args_local._7_1_;
}

Assistant:

bool HandleExportMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;
  std::string cxx_modules_directory;

  ica.Bind("EXPORT"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    *helper.Makefile, cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    ica.Bind("CXX_MODULES_DIRECTORY"_s, cxx_modules_directory);
  }

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  "
                             "The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    status.SetError(
      cmStrCat(args[0], " given invalid export file name \"", fname,
               "\".  "
               "The FILE argument must specify a name ending in \".cmake\"."));
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = cmStrCat(exp, ".cmake");

    if (fname.find_first_of(":/\\") != std::string::npos) {
      status.SetError(cmStrCat(
        args[0], " given export name \"", exp,
        "\".  "
        "This name cannot be safely converted to a file name.  "
        "Specify a different export name or use the FILE option to set "
        "a file name explicitly."));
      return false;
    }
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];
  if (exportOld) {
    for (auto const& te : exportSet.GetTargetExports()) {
      cmTarget* tgt =
        helper.Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        status.SetError(cmStrCat(
          "INSTALL(EXPORT) given keyword \""
          "EXPORT_LINK_INTERFACE_LIBRARIES\", but target \"",
          te->TargetName, "\" does not have policy CMP0022 set to NEW."));
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, cxx_modules_directory,
      exportOld, false, helper.Makefile->GetBacktrace()));

  return true;
}